

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reductors.cpp
# Opt level: O0

void opengv::relative_pose::modules::fivept_kneip::groebnerRow46_000000000_f
               (Matrix<double,_66,_197,_0,_66,_197> *groebnerMatrix,int targetRow)

{
  Scalar SVar1;
  Scalar *pSVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  double factor;
  Index in_stack_fffffffffffffd68;
  DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1> *in_stack_fffffffffffffd70;
  DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1> *this;
  
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,0x107a960);
  this = (DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1> *)*pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd68,0x107a981);
  dVar3 = (double)this / *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd68,0x107a9ae);
  *pSVar2 = 0.0;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd68,0x107a9dc);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd68,0x107aa00);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = SVar1;
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *pSVar2;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar4,auVar43,auVar82);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd68,0x107aa56);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd68,0x107aa7a);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = SVar1;
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *pSVar2;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar5,auVar44,auVar83);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd68,0x107aad0);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd68,0x107aaf4);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = SVar1;
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *pSVar2;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar6,auVar45,auVar84);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd68,0x107ab4a);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd68,0x107ab6e);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = SVar1;
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *pSVar2;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar7,auVar46,auVar85);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd68,0x107abc4);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd68,0x107abe8);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = SVar1;
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *pSVar2;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar8,auVar47,auVar86);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd68,0x107ac3e);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd68,0x107ac62);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = SVar1;
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *pSVar2;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar9,auVar48,auVar87);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd68,0x107acb8);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd68,0x107acdc);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = SVar1;
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *pSVar2;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar10,auVar49,auVar88);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd68,0x107ad35);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd68,0x107ad5c);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = SVar1;
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *pSVar2;
  auVar50._8_8_ = 0;
  auVar50._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar11,auVar50,auVar89);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd68,0x107adbb);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd68,0x107ade2);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = SVar1;
  auVar90._8_8_ = 0;
  auVar90._0_8_ = *pSVar2;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar12,auVar51,auVar90);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd68,0x107ae41);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd68,0x107ae68);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = SVar1;
  auVar91._8_8_ = 0;
  auVar91._0_8_ = *pSVar2;
  auVar52._8_8_ = 0;
  auVar52._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar13,auVar52,auVar91);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd68,0x107aec7);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd68,0x107aeee);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = SVar1;
  auVar92._8_8_ = 0;
  auVar92._0_8_ = *pSVar2;
  auVar53._8_8_ = 0;
  auVar53._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar14,auVar53,auVar92);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd68,0x107af4d);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd68,0x107af74);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = SVar1;
  auVar93._8_8_ = 0;
  auVar93._0_8_ = *pSVar2;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar15,auVar54,auVar93);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd68,0x107afd3);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd68,0x107affa);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = SVar1;
  auVar94._8_8_ = 0;
  auVar94._0_8_ = *pSVar2;
  auVar55._8_8_ = 0;
  auVar55._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar16,auVar55,auVar94);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd68,0x107b059);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd68,0x107b080);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = SVar1;
  auVar95._8_8_ = 0;
  auVar95._0_8_ = *pSVar2;
  auVar56._8_8_ = 0;
  auVar56._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar17,auVar56,auVar95);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd68,0x107b0df);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd68,0x107b106);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = SVar1;
  auVar96._8_8_ = 0;
  auVar96._0_8_ = *pSVar2;
  auVar57._8_8_ = 0;
  auVar57._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar18,auVar57,auVar96);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd68,0x107b165);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd68,0x107b18c);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = SVar1;
  auVar97._8_8_ = 0;
  auVar97._0_8_ = *pSVar2;
  auVar58._8_8_ = 0;
  auVar58._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar19,auVar58,auVar97);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd68,0x107b1eb);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd68,0x107b212);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = SVar1;
  auVar98._8_8_ = 0;
  auVar98._0_8_ = *pSVar2;
  auVar59._8_8_ = 0;
  auVar59._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar20,auVar59,auVar98);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd68,0x107b271);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd68,0x107b298);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = SVar1;
  auVar99._8_8_ = 0;
  auVar99._0_8_ = *pSVar2;
  auVar60._8_8_ = 0;
  auVar60._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar21,auVar60,auVar99);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd68,0x107b2f7);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd68,0x107b31e);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = SVar1;
  auVar100._8_8_ = 0;
  auVar100._0_8_ = *pSVar2;
  auVar61._8_8_ = 0;
  auVar61._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar22,auVar61,auVar100);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd68,0x107b37d);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd68,0x107b3a4);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = SVar1;
  auVar101._8_8_ = 0;
  auVar101._0_8_ = *pSVar2;
  auVar62._8_8_ = 0;
  auVar62._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar23,auVar62,auVar101);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd68,0x107b403);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd68,0x107b42a);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = SVar1;
  auVar102._8_8_ = 0;
  auVar102._0_8_ = *pSVar2;
  auVar63._8_8_ = 0;
  auVar63._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar24,auVar63,auVar102);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd68,0x107b489);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd68,0x107b4b0);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = SVar1;
  auVar103._8_8_ = 0;
  auVar103._0_8_ = *pSVar2;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar25,auVar64,auVar103);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd68,0x107b50f);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd68,0x107b536);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = SVar1;
  auVar104._8_8_ = 0;
  auVar104._0_8_ = *pSVar2;
  auVar65._8_8_ = 0;
  auVar65._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar26,auVar65,auVar104);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd68,0x107b595);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd68,0x107b5bc);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = SVar1;
  auVar105._8_8_ = 0;
  auVar105._0_8_ = *pSVar2;
  auVar66._8_8_ = 0;
  auVar66._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar27,auVar66,auVar105);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd68,0x107b61b);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd68,0x107b642);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = SVar1;
  auVar106._8_8_ = 0;
  auVar106._0_8_ = *pSVar2;
  auVar67._8_8_ = 0;
  auVar67._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar28,auVar67,auVar106);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd68,0x107b6a1);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd68,0x107b6c8);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = SVar1;
  auVar107._8_8_ = 0;
  auVar107._0_8_ = *pSVar2;
  auVar68._8_8_ = 0;
  auVar68._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar29,auVar68,auVar107);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd68,0x107b727);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd68,0x107b74e);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = SVar1;
  auVar108._8_8_ = 0;
  auVar108._0_8_ = *pSVar2;
  auVar69._8_8_ = 0;
  auVar69._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar30,auVar69,auVar108);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd68,0x107b7ad);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd68,0x107b7d4);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = SVar1;
  auVar109._8_8_ = 0;
  auVar109._0_8_ = *pSVar2;
  auVar70._8_8_ = 0;
  auVar70._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar31,auVar70,auVar109);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd68,0x107b833);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd68,0x107b85a);
  auVar32._8_8_ = 0;
  auVar32._0_8_ = SVar1;
  auVar110._8_8_ = 0;
  auVar110._0_8_ = *pSVar2;
  auVar71._8_8_ = 0;
  auVar71._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar32,auVar71,auVar110);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd68,0x107b8b9);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd68,0x107b8e0);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = SVar1;
  auVar111._8_8_ = 0;
  auVar111._0_8_ = *pSVar2;
  auVar72._8_8_ = 0;
  auVar72._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar33,auVar72,auVar111);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd68,0x107b93f);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd68,0x107b966);
  auVar34._8_8_ = 0;
  auVar34._0_8_ = SVar1;
  auVar112._8_8_ = 0;
  auVar112._0_8_ = *pSVar2;
  auVar73._8_8_ = 0;
  auVar73._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar34,auVar73,auVar112);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd68,0x107b9c5);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd68,0x107b9ec);
  auVar35._8_8_ = 0;
  auVar35._0_8_ = SVar1;
  auVar113._8_8_ = 0;
  auVar113._0_8_ = *pSVar2;
  auVar74._8_8_ = 0;
  auVar74._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar35,auVar74,auVar113);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd68,0x107ba4b);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd68,0x107ba72);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = SVar1;
  auVar114._8_8_ = 0;
  auVar114._0_8_ = *pSVar2;
  auVar75._8_8_ = 0;
  auVar75._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar36,auVar75,auVar114);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd68,0x107bad1);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd68,0x107baf8);
  auVar37._8_8_ = 0;
  auVar37._0_8_ = SVar1;
  auVar115._8_8_ = 0;
  auVar115._0_8_ = *pSVar2;
  auVar76._8_8_ = 0;
  auVar76._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar37,auVar76,auVar115);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd68,0x107bb57);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd68,0x107bb7e);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = SVar1;
  auVar116._8_8_ = 0;
  auVar116._0_8_ = *pSVar2;
  auVar77._8_8_ = 0;
  auVar77._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar38,auVar77,auVar116);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd68,0x107bbdd);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd68,0x107bc04);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = SVar1;
  auVar117._8_8_ = 0;
  auVar117._0_8_ = *pSVar2;
  auVar78._8_8_ = 0;
  auVar78._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar39,auVar78,auVar117);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd68,0x107bc63);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd68,0x107bc8a);
  auVar40._8_8_ = 0;
  auVar40._0_8_ = SVar1;
  auVar118._8_8_ = 0;
  auVar118._0_8_ = *pSVar2;
  auVar79._8_8_ = 0;
  auVar79._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar40,auVar79,auVar118);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd68,0x107bce9);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd68,0x107bd10);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = SVar1;
  auVar119._8_8_ = 0;
  auVar119._0_8_ = *pSVar2;
  auVar80._8_8_ = 0;
  auVar80._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar41,auVar80,auVar119);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd68,0x107bd6f);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffd68,0x107bd96);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = SVar1;
  auVar120._8_8_ = 0;
  auVar120._0_8_ = *pSVar2;
  auVar81._8_8_ = 0;
  auVar81._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar42,auVar81,auVar120);
  *pSVar2 = auVar4._0_8_;
  return;
}

Assistant:

void
opengv::relative_pose::modules::fivept_kneip::groebnerRow46_000000000_f( Eigen::Matrix<double,66,197> & groebnerMatrix, int targetRow )
{
  double factor = groebnerMatrix(targetRow,125) / groebnerMatrix(46,125);
  groebnerMatrix(targetRow,125) = 0.0;
  groebnerMatrix(targetRow,126) -= factor * groebnerMatrix(46,126);
  groebnerMatrix(targetRow,128) -= factor * groebnerMatrix(46,128);
  groebnerMatrix(targetRow,129) -= factor * groebnerMatrix(46,129);
  groebnerMatrix(targetRow,131) -= factor * groebnerMatrix(46,131);
  groebnerMatrix(targetRow,132) -= factor * groebnerMatrix(46,132);
  groebnerMatrix(targetRow,133) -= factor * groebnerMatrix(46,133);
  groebnerMatrix(targetRow,134) -= factor * groebnerMatrix(46,134);
  groebnerMatrix(targetRow,135) -= factor * groebnerMatrix(46,135);
  groebnerMatrix(targetRow,136) -= factor * groebnerMatrix(46,136);
  groebnerMatrix(targetRow,137) -= factor * groebnerMatrix(46,137);
  groebnerMatrix(targetRow,138) -= factor * groebnerMatrix(46,138);
  groebnerMatrix(targetRow,139) -= factor * groebnerMatrix(46,139);
  groebnerMatrix(targetRow,140) -= factor * groebnerMatrix(46,140);
  groebnerMatrix(targetRow,141) -= factor * groebnerMatrix(46,141);
  groebnerMatrix(targetRow,170) -= factor * groebnerMatrix(46,170);
  groebnerMatrix(targetRow,171) -= factor * groebnerMatrix(46,171);
  groebnerMatrix(targetRow,173) -= factor * groebnerMatrix(46,173);
  groebnerMatrix(targetRow,174) -= factor * groebnerMatrix(46,174);
  groebnerMatrix(targetRow,176) -= factor * groebnerMatrix(46,176);
  groebnerMatrix(targetRow,177) -= factor * groebnerMatrix(46,177);
  groebnerMatrix(targetRow,178) -= factor * groebnerMatrix(46,178);
  groebnerMatrix(targetRow,179) -= factor * groebnerMatrix(46,179);
  groebnerMatrix(targetRow,180) -= factor * groebnerMatrix(46,180);
  groebnerMatrix(targetRow,181) -= factor * groebnerMatrix(46,181);
  groebnerMatrix(targetRow,182) -= factor * groebnerMatrix(46,182);
  groebnerMatrix(targetRow,183) -= factor * groebnerMatrix(46,183);
  groebnerMatrix(targetRow,184) -= factor * groebnerMatrix(46,184);
  groebnerMatrix(targetRow,185) -= factor * groebnerMatrix(46,185);
  groebnerMatrix(targetRow,186) -= factor * groebnerMatrix(46,186);
  groebnerMatrix(targetRow,187) -= factor * groebnerMatrix(46,187);
  groebnerMatrix(targetRow,188) -= factor * groebnerMatrix(46,188);
  groebnerMatrix(targetRow,189) -= factor * groebnerMatrix(46,189);
  groebnerMatrix(targetRow,190) -= factor * groebnerMatrix(46,190);
  groebnerMatrix(targetRow,191) -= factor * groebnerMatrix(46,191);
  groebnerMatrix(targetRow,192) -= factor * groebnerMatrix(46,192);
  groebnerMatrix(targetRow,193) -= factor * groebnerMatrix(46,193);
  groebnerMatrix(targetRow,194) -= factor * groebnerMatrix(46,194);
  groebnerMatrix(targetRow,195) -= factor * groebnerMatrix(46,195);
  groebnerMatrix(targetRow,196) -= factor * groebnerMatrix(46,196);
}